

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccesscache.cpp
# Opt level: O2

void __thiscall QNetworkAccessCache::timerEvent(QNetworkAccessCache *this,QTimerEvent *param_1)

{
  long lVar1;
  void *pvVar2;
  char cVar3;
  QNetworkAccessCache *pQVar4;
  long lVar5;
  
  lVar5 = *(long *)(this + 0x18);
  do {
    if (lVar5 == 0) {
LAB_00174599:
      pQVar4 = this + 0x20;
LAB_0017459d:
      *(undefined8 *)pQVar4 = 0;
      updateTimer(this);
      return;
    }
    cVar3 = QDeadlineTimer::hasExpired();
    lVar1 = *(long *)(this + 0x18);
    if (cVar3 == '\0') {
      if (lVar1 != 0) {
        pQVar4 = (QNetworkAccessCache *)(lVar1 + 0x28);
        goto LAB_0017459d;
      }
      goto LAB_00174599;
    }
    lVar5 = *(long *)(lVar1 + 0x30);
    (**(code **)(**(long **)(lVar1 + 0x38) + 0x10))();
    QHash<QByteArray,_QNetworkAccessCache::Node_*>::removeImpl<QByteArray>
              ((QHash<QByteArray,_QNetworkAccessCache::Node_*> *)(this + 0x10),
               (QByteArray *)(*(long *)(this + 0x18) + 0x10));
    pvVar2 = *(void **)(this + 0x18);
    if (pvVar2 != (void *)0x0) {
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)((long)pvVar2 + 0x10));
    }
    operator_delete(pvVar2,0x48);
    *(long *)(this + 0x18) = lVar5;
  } while( true );
}

Assistant:

void QNetworkAccessCache::timerEvent(QTimerEvent *)
{
    while (firstExpiringNode && firstExpiringNode->timer.hasExpired()) {
        Node *next = firstExpiringNode->next;
        firstExpiringNode->object->dispose();
        hash.remove(firstExpiringNode->key); // `firstExpiringNode` gets deleted
        delete firstExpiringNode;
        firstExpiringNode = next;
    }

    // fixup the list
    if (firstExpiringNode)
        firstExpiringNode->previous = nullptr;
    else
        lastExpiringNode = nullptr;

    updateTimer();
}